

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_constrained_multi_parallelogram_decoder.h
# Opt level: O2

bool __thiscall
draco::
MeshPredictionSchemeConstrainedMultiParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
::DecodePredictionData
          (MeshPredictionSchemeConstrainedMultiParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           *this,DecoderBuffer *buffer)

{
  CornerTable *pCVar1;
  bool bVar2;
  ulong *puVar3;
  ulong uVar4;
  uint32_t j;
  ulong __n;
  vector<bool,_std::allocator<bool>_> *this_00;
  long lVar5;
  reference rVar6;
  uint32_t num_flags;
  uint8_t mode;
  uint local_5c;
  MeshPredictionSchemeConstrainedMultiParallelogramDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  *local_58;
  vector<bool,_std::allocator<bool>_> *local_50;
  RAnsBitDecoder local_48;
  
  local_58 = this;
  if (buffer->bitstream_version_ < 0x202) {
    bVar2 = DecoderBuffer::Decode<unsigned_char>(buffer,(uchar *)&local_48);
    if (!bVar2) {
      return false;
    }
    if ((char)local_48.ans_decoder_.buf != '\0') {
      return false;
    }
  }
  local_50 = local_58->is_crease_edge_;
  lVar5 = 0;
  while( true ) {
    if (lVar5 == 4) {
      bVar2 = PredictionSchemeWrapDecodingTransform<int,_int>::DecodeTransformData
                        (&(local_58->
                          super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
                          ).
                          super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                          .transform_,buffer);
      return bVar2;
    }
    bVar2 = DecodeVarint<unsigned_int>(&local_5c,buffer);
    if ((!bVar2) ||
       (pCVar1 = ((local_58->
                  super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
                  ).mesh_data_.corner_table_)->corner_table_,
       (uint)((ulong)((long)(pCVar1->corner_to_vertex_map_).vector_.
                            super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pCVar1->corner_to_vertex_map_).vector_.
                           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2) < local_5c)) break;
    if ((ulong)local_5c != 0) {
      this_00 = local_50 + lVar5;
      std::vector<bool,_std::allocator<bool>_>::resize(this_00,(ulong)local_5c,false);
      RAnsBitDecoder::RAnsBitDecoder(&local_48);
      bVar2 = RAnsBitDecoder::StartDecoding(&local_48,buffer);
      if (!bVar2) {
        RAnsBitDecoder::~RAnsBitDecoder(&local_48);
        return false;
      }
      for (__n = 0; __n < local_5c; __n = __n + 1) {
        bVar2 = RAnsBitDecoder::DecodeNextBit(&local_48);
        rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,__n);
        puVar3 = rVar6._M_p;
        if (bVar2) {
          uVar4 = rVar6._M_mask | *puVar3;
        }
        else {
          uVar4 = ~rVar6._M_mask & *puVar3;
        }
        *puVar3 = uVar4;
      }
      RAnsBitDecoder::~RAnsBitDecoder(&local_48);
    }
    lVar5 = lVar5 + 1;
  }
  return false;
}

Assistant:

bool MeshPredictionSchemeConstrainedMultiParallelogramDecoder<
    DataTypeT, TransformT, MeshDataT>::DecodePredictionData(DecoderBuffer
                                                                *buffer) {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (buffer->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
    // Decode prediction mode.
    uint8_t mode;
    if (!buffer->Decode(&mode)) {
      return false;
    }

    if (mode != Mode::OPTIMAL_MULTI_PARALLELOGRAM) {
      // Unsupported mode.
      return false;
    }
  }
#endif

  // Encode selected edges using separate rans bit coder for each context.
  for (int i = 0; i < kMaxNumParallelograms; ++i) {
    uint32_t num_flags;
    if (!DecodeVarint<uint32_t>(&num_flags, buffer)) {
      return false;
    }
    if (num_flags > this->mesh_data().corner_table()->num_corners()) {
      return false;
    }
    if (num_flags > 0) {
      is_crease_edge_[i].resize(num_flags);
      RAnsBitDecoder decoder;
      if (!decoder.StartDecoding(buffer)) {
        return false;
      }
      for (uint32_t j = 0; j < num_flags; ++j) {
        is_crease_edge_[i][j] = decoder.DecodeNextBit();
      }
      decoder.EndDecoding();
    }
  }
  return MeshPredictionSchemeDecoder<DataTypeT, TransformT,
                                     MeshDataT>::DecodePredictionData(buffer);
}